

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

void __thiscall
sjtu::FileManager<std::pair<sjtu::orderType,_long>_>::save
          (FileManager<std::pair<sjtu::orderType,_long>_> *this,locType *offset)

{
  LRUCache<std::pair<sjtu::orderType,_long>_>::dirty_page_set
            ((this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).cache,offset);
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}